

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgUtils.hpp
# Opt level: O0

unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
__thiscall
TasGrid::Utils::make_unique<TasGrid::GridLocalPolynomial,TasGrid::AccelerationContext_const*&>
          (Utils *this,AccelerationContext **args)

{
  GridLocalPolynomial *this_00;
  AccelerationContext **args_local;
  
  this_00 = (GridLocalPolynomial *)operator_new(0x150);
  GridLocalPolynomial::GridLocalPolynomial(this_00,*args);
  ::std::unique_ptr<TasGrid::GridLocalPolynomial,std::default_delete<TasGrid::GridLocalPolynomial>>
  ::unique_ptr<std::default_delete<TasGrid::GridLocalPolynomial>,void>
            ((unique_ptr<TasGrid::GridLocalPolynomial,std::default_delete<TasGrid::GridLocalPolynomial>>
              *)this,this_00);
  return (__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args){
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}